

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sym.cpp
# Opt level: O1

int32 __thiscall StackSym::GetIntConstValue(StackSym *this)

{
  Instr *instr;
  IntConstOpnd *this_00;
  code *pcVar1;
  bool bVar2;
  OpndKind OVar3;
  uint uVar4;
  int32 iVar5;
  undefined4 *puVar6;
  char *message;
  char *error;
  double value;
  char16 *pcVar7;
  uint lineNumber;
  char *fileName;
  
  while( true ) {
    VerifyConstFlags(this);
    if ((this->field_0x18 & 0x10) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.cpp"
                         ,0x245,"(this->IsIntConst())","this->IsIntConst()");
      if (!bVar2) goto LAB_0063370c;
      *puVar6 = 0;
    }
    instr = (this->field_5).m_instrDef;
    this_00 = (IntConstOpnd *)instr->m_src1;
    OVar3 = IR::Opnd::GetKind((Opnd *)this_00);
    if (OVar3 == OpndKindIntConst) {
      uVar4 = instr->m_opcode - 0x1e4;
      if ((10 < uVar4) || ((0x403U >> (uVar4 & 0x1f) & 1) == 0)) {
        bVar2 = LowererMD::IsAssign(instr);
        if (!bVar2) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar6 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.cpp"
                             ,0x24b,
                             "(defInstr->m_opcode == Js::OpCode::Ld_I4 || defInstr->m_opcode == Js::OpCode::LdC_A_I4 || defInstr->m_opcode == Js::OpCode::ArgOut_A_InlineBuiltIn || LowererMD::IsAssign(defInstr))"
                             ,
                             "defInstr->m_opcode == Js::OpCode::Ld_I4 || defInstr->m_opcode == Js::OpCode::LdC_A_I4 || defInstr->m_opcode == Js::OpCode::ArgOut_A_InlineBuiltIn || LowererMD::IsAssign(defInstr)"
                            );
          if (!bVar2) goto LAB_0063370c;
          *puVar6 = 0;
        }
      }
      OVar3 = IR::Opnd::GetKind((Opnd *)this_00);
      if (OVar3 != OpndKindIntConst) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
        if (!bVar2) goto LAB_0063370c;
        *puVar6 = 0;
      }
      iVar5 = IR::IntConstOpnd::AsInt32(this_00);
      return iVar5;
    }
    OVar3 = IR::Opnd::GetKind((Opnd *)this_00);
    if (OVar3 == OpndKindAddr) break;
    OVar3 = IR::Opnd::GetKind((Opnd *)this_00);
    if (OVar3 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.cpp"
                         ,0x25e,"(src1->IsRegOpnd())","src1->IsRegOpnd()");
      if (!bVar2) goto LAB_0063370c;
      *puVar6 = 0;
    }
    OVar3 = IR::Opnd::GetKind((Opnd *)this_00);
    if (OVar3 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar2) goto LAB_0063370c;
      *puVar6 = 0;
    }
    this = (StackSym *)(this_00->super_EncodableOpnd<long>).m_value;
  }
  if (instr->m_opcode != Ld_A) {
    bVar2 = LowererMD::IsAssign(instr);
    if (((!bVar2) && (instr->m_opcode != ArgOut_A)) && (instr->m_opcode != ArgOut_A_InlineBuiltIn))
    {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.cpp"
                         ,0x251,
                         "(defInstr->m_opcode == Js::OpCode::Ld_A || LowererMD::IsAssign(defInstr) || defInstr->m_opcode == Js::OpCode::ArgOut_A || defInstr->m_opcode == Js::OpCode::ArgOut_A_InlineBuiltIn)"
                         ,
                         "defInstr->m_opcode == Js::OpCode::Ld_A || LowererMD::IsAssign(defInstr) || defInstr->m_opcode == Js::OpCode::ArgOut_A || defInstr->m_opcode == Js::OpCode::ArgOut_A_InlineBuiltIn"
                        );
      if (!bVar2) goto LAB_0063370c;
      *puVar6 = 0;
    }
  }
  OVar3 = IR::Opnd::GetKind((Opnd *)this_00);
  if (OVar3 != OpndKindAddr) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x18e,"(this->IsAddrOpnd())","Bad call to AsAddrOpnd()");
    if (!bVar2) goto LAB_0063370c;
    *puVar6 = 0;
  }
  if ((this_00->field_0x29 != '\x01') && (this_00->field_0x29 != '\n')) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.cpp"
                       ,0x253,"(addr->IsVar())","addr->IsVar()");
    if (!bVar2) goto LAB_0063370c;
    *puVar6 = 0;
  }
  OVar3 = IR::Opnd::GetKind((Opnd *)this_00);
  if (OVar3 != OpndKindAddr) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x18e,"(this->IsAddrOpnd())","Bad call to AsAddrOpnd()");
    if (!bVar2) goto LAB_0063370c;
    *puVar6 = 0;
  }
  pcVar7 = (this_00->super_EncodableOpnd<long>).name;
  if (((ulong)pcVar7 & 0x1ffff00000000) != 0x1000000000000 &&
      ((ulong)pcVar7 & 0xffff000000000000) == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Language/TaggedInt.inl"
                       ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                       "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) goto LAB_0063370c;
    *puVar6 = 0;
  }
  if (((ulong)pcVar7 & 0xffff000000000000) == 0x1000000000000) {
    if (((ulong)pcVar7 & 0x1ffff00000000) == 0x1000000000000) goto LAB_006336fb;
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    fileName = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Language/TaggedInt.inl"
    ;
    error = "((uintptr_t)aValue >> 32 == (AtomTag << 16))";
    message = "(uintptr_t)aValue >> 32 == (AtomTag << 16)";
    lineNumber = 0x2a;
  }
  else {
    if ((ulong)pcVar7 >> 0x32 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Library/JavascriptNumber.h"
                         ,0xd4,"(Is(aValue))","Ensure var is actually a \'JavascriptNumber\'");
      if (!bVar2) goto LAB_0063370c;
      *puVar6 = 0;
    }
    value = (double)((ulong)pcVar7 ^ 0xfffc000000000000);
    if (((double)(int)value != value) || (NAN((double)(int)value) || NAN(value))) {
      pcVar7 = (char16 *)0xcccccccc;
      bVar2 = false;
    }
    else {
      bVar2 = Js::NumberUtilities::IsSpecial(value,0x8000000000000000);
      pcVar7 = (char16 *)0xcccccccc;
      if (!bVar2) {
        pcVar7 = (char16 *)(ulong)(uint)(int)value;
      }
      bVar2 = !bVar2;
    }
    if (bVar2) goto LAB_006336fb;
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    fileName = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.cpp"
    ;
    error = "(isInt32)";
    message = "isInt32";
    lineNumber = 0x25b;
  }
  bVar2 = Js::Throw::ReportAssert(fileName,lineNumber,error,message);
  if (bVar2) {
    *puVar6 = 0;
LAB_006336fb:
    return (int32)pcVar7;
  }
LAB_0063370c:
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

int32
StackSym::GetIntConstValue() const
{
    Assert(this->IsIntConst());
    IR::Instr *defInstr = this->m_instrDef;
    IR::Opnd *src1 = defInstr->GetSrc1();

    if (src1->IsIntConstOpnd())
    {
        Assert(defInstr->m_opcode == Js::OpCode::Ld_I4 || defInstr->m_opcode == Js::OpCode::LdC_A_I4 || defInstr->m_opcode == Js::OpCode::ArgOut_A_InlineBuiltIn || LowererMD::IsAssign(defInstr));
        return src1->AsIntConstOpnd()->AsInt32();
    }

    if (src1->IsAddrOpnd())
    {
        Assert(defInstr->m_opcode == Js::OpCode::Ld_A || LowererMD::IsAssign(defInstr) || defInstr->m_opcode == Js::OpCode::ArgOut_A || defInstr->m_opcode == Js::OpCode::ArgOut_A_InlineBuiltIn);
        IR::AddrOpnd *addr = src1->AsAddrOpnd();
        Assert(addr->IsVar());
        Js::Var var = src1->AsAddrOpnd()->m_address;
        if (Js::TaggedInt::Is(var))
        {
            return Js::TaggedInt::ToInt32(var);
        }
        int32 value = 0xCCCCCCCC;
        const bool isInt32 = Js::JavascriptNumber::TryGetInt32Value(Js::JavascriptNumber::GetValue(var), &value);
        Assert(isInt32);
        return value;
    }
    Assert(src1->IsRegOpnd());
    return src1->AsRegOpnd()->m_sym->GetIntConstValue();
}